

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O2

pair<int,_int> *
frozen::bits::partition<std::pair<int,int>*,frozen::impl::CompareKey<std::less<int>>>
          (pair<int,_int> *left,pair<int,_int> *right,CompareKey<std::less<int>_> *compare)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  
  lVar4 = (long)right - (long)left;
  lVar2 = (lVar4 >> 3) / 2;
  iVar1 = right->first;
  right->first = left[lVar2].first;
  left[lVar2].first = iVar1;
  iVar1 = right->second;
  right->second = left[lVar2].second;
  left[lVar2].second = iVar1;
  piVar3 = &left->second;
  for (; 0 < lVar4; lVar4 = lVar4 + -8) {
    iVar1 = ((pair<int,_int> *)(piVar3 + -1))->first;
    if (iVar1 < right->first) {
      ((pair<int,_int> *)(piVar3 + -1))->first = left->first;
      left->first = iVar1;
      iVar1 = *piVar3;
      *piVar3 = left->second;
      left->second = iVar1;
      left = left + 1;
    }
    piVar3 = piVar3 + 2;
  }
  iVar1 = right->first;
  right->first = left->first;
  left->first = iVar1;
  iVar1 = right->second;
  right->second = left->second;
  left->second = iVar1;
  return left;
}

Assistant:

constexpr Iterator partition(Iterator left, Iterator right, Compare const &compare) {
  auto pivot = left + (right - left) / 2;
  iter_swap(right, pivot);
  pivot = right;
  for (auto it = left; 0 < right - it; ++it) {
    if (compare(*it, *pivot)) {
      iter_swap(it, left);
      left++;
    }
  }
  iter_swap(pivot, left);
  pivot = left;
  return pivot;
}